

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Chunk ch;
  array<char,_4UL> local_25c;
  vector<char,_std::allocator<char>_> buffer;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  Chunk local_220;
  Chunk local_218;
  ifstream stream;
  
  std::ifstream::ifstream(&stream,"minimal_2.riff",_S_bin);
  riffcpp::Chunk::Chunk(&ch,"minimal_2.riff");
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = riffcpp::Chunk::id(&ch);
  bVar1 = std::operator==((array<char,_4UL> *)&chunks,(array<char,_4UL> *)&riffcpp::riff_id);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
    std::operator<<(poVar3,"): OK\n");
    chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = riffcpp::Chunk::type(&ch);
    bVar1 = std::operator==((array<char,_4UL> *)&chunks,&smpl_id);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"ch.type() == smpl_id (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
      std::operator<<(poVar3,"): OK\n");
      riffcpp::Chunk::begin(&local_218,SUB81(&ch,0));
      riffcpp::Chunk::end(&local_220);
      std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
      vector<riffcpp::Chunk::iterator,void>
                ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&chunks,
                 (iterator *)&local_218,(iterator *)&local_220,(allocator_type *)&local_25c);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_220);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_218);
      if ((long)chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
                super__Vector_impl_data._M_finish -
          CONCAT44(chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                   _M_impl.super__Vector_impl_data._M_start._0_4_) == 0x10) {
        poVar3 = std::operator<<((ostream *)&std::cout,"chunks.size() == 2 (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
        std::operator<<(poVar3,"): OK\n");
        local_25c._M_elems =
             (_Type)riffcpp::Chunk::id((Chunk *)CONCAT44(chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_));
        bVar1 = std::operator==(&local_25c,&tst1_id);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"chunks[0].id() == tst1_id (");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
          std::operator<<(poVar3,"): OK\n");
          uVar2 = riffcpp::Chunk::size
                            ((Chunk *)CONCAT44(chunks.
                                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               chunks.
                                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_));
          std::vector<char,_std::allocator<char>_>::resize(&buffer,(ulong)uVar2);
          riffcpp::Chunk::read_data
                    ((Chunk *)CONCAT44(chunks.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       chunks.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_),
                     buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          if ((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start == 1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"buffer.size() == 1 (");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf);
            std::operator<<(poVar3,"): OK\n");
            if (*buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start == -1) {
              poVar3 = std::operator<<((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xFF (");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10);
              std::operator<<(poVar3,"): OK\n");
              local_25c._M_elems =
                   (_Type)riffcpp::Chunk::id((Chunk *)(CONCAT44(chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                                  8));
              bVar1 = std::operator==(&local_25c,&tst2_id);
              if (bVar1) {
                poVar3 = std::operator<<((ostream *)&std::cout,"chunks[1].id() == tst2_id (");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12);
                std::operator<<(poVar3,"): OK\n");
                uVar2 = riffcpp::Chunk::size
                                  ((Chunk *)(CONCAT44(chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  chunks.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                            8));
                std::vector<char,_std::allocator<char>_>::resize(&buffer,(ulong)uVar2);
                riffcpp::Chunk::read_data
                          ((Chunk *)(CONCAT44(chunks.
                                              super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              chunks.
                                              super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8),
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                if ((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start == 1) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"buffer.size() == 1 (");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x15);
                  std::operator<<(poVar3,"): OK\n");
                  if (*buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start == -0x12) {
                    poVar3 = std::operator<<((ostream *)&std::cout,
                                             "(unsigned char)buffer[0] == 0xEE (");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
                    std::operator<<(poVar3,"): OK\n");
                    std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector(&chunks);
                    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
                    riffcpp::Chunk::~Chunk(&ch);
                    std::ifstream::~ifstream(&stream);
                    return 0;
                  }
                  poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
                  poVar3 = std::operator<<(poVar3,": (unsigned char)buffer[0] == 0xEE\n");
                  poVar3 = std::operator<<(poVar3,"Reason: ");
                  poVar3 = std::operator<<(poVar3,"Subchunk must contain \'0xFF\'");
                  std::operator<<(poVar3,'\n');
                }
                else {
                  poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x15);
                  poVar3 = std::operator<<(poVar3,": buffer.size() == 1\n");
                  poVar3 = std::operator<<(poVar3,"Reason: ");
                  poVar3 = std::operator<<(poVar3,"Subchunk must have data size 1");
                  std::operator<<(poVar3,'\n');
                }
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12);
                poVar3 = std::operator<<(poVar3,": chunks[1].id() == tst2_id\n");
                poVar3 = std::operator<<(poVar3,"Reason: ");
                poVar3 = std::operator<<(poVar3,"Subchunk must have \'tst2\' id");
                std::operator<<(poVar3,'\n');
              }
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10);
              poVar3 = std::operator<<(poVar3,": (unsigned char)buffer[0] == 0xFF\n");
              poVar3 = std::operator<<(poVar3,"Reason: ");
              poVar3 = std::operator<<(poVar3,"Subchunk must contain \'0xFF\'");
              std::operator<<(poVar3,'\n');
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf);
            poVar3 = std::operator<<(poVar3,": buffer.size() == 1\n");
            poVar3 = std::operator<<(poVar3,"Reason: ");
            poVar3 = std::operator<<(poVar3,"Subchunk must have data size 1");
            std::operator<<(poVar3,'\n');
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
          poVar3 = std::operator<<(poVar3,": chunks[0].id() == tst1_id\n");
          poVar3 = std::operator<<(poVar3,"Reason: ");
          poVar3 = std::operator<<(poVar3,"Subchunk must have \'tst1\' id");
          std::operator<<(poVar3,'\n');
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
        poVar3 = std::operator<<(poVar3,": chunks.size() == 2\n");
        poVar3 = std::operator<<(poVar3,"Reason: ");
        poVar3 = std::operator<<(poVar3,"Toplevel chunk must contain two subchunks");
        std::operator<<(poVar3,'\n');
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
      poVar3 = std::operator<<(poVar3,": ch.type() == smpl_id\n");
      poVar3 = std::operator<<(poVar3,"Reason: ");
      poVar3 = std::operator<<(poVar3,"Expected \'smpl\' chunk");
      std::operator<<(poVar3,'\n');
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
    poVar3 = std::operator<<(poVar3,": ch.id() == riffcpp::riff_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Toplevel \'RIFF\' id expected");
    std::operator<<(poVar3,'\n');
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  std::ifstream stream("minimal_2.riff", std::ios::binary);
  riffcpp::Chunk ch("minimal_2.riff");
  std::vector<char> buffer;
  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks(ch.begin(), ch.end());
  TEST_ASSERT(chunks.size() == 2, "Toplevel chunk must contain two subchunks");

  TEST_ASSERT(chunks[0].id() == tst1_id, "Subchunk must have 'tst1' id");
  buffer.resize(chunks[0].size());
  chunks[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xFF, "Subchunk must contain '0xFF'");

  TEST_ASSERT(chunks[1].id() == tst2_id, "Subchunk must have 'tst2' id");
  buffer.resize(chunks[1].size());
  chunks[1].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xEE, "Subchunk must contain '0xFF'");
}